

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O3

void cie_lab(double *p)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  int j;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar5 = xyz_whitepoint[2];
  dVar4 = xyz_whitepoint[0];
  dVar9 = 0.0;
  dVar10 = 0.0;
  lVar6 = 0;
  dVar7 = 0.0;
  do {
    dVar8 = p[lVar6];
    pdVar1 = rgb_to_xyz[0] + lVar6;
    pdVar2 = rgb_to_xyz[1] + lVar6;
    pdVar3 = rgb_to_xyz[2] + lVar6;
    lVar6 = lVar6 + 1;
    dVar9 = dVar9 + dVar8 * *pdVar1;
    dVar7 = dVar7 + dVar8 * *pdVar2;
    dVar10 = dVar10 + dVar8 * *pdVar3;
  } while (lVar6 != 3);
  dVar7 = dVar7 / xyz_whitepoint[1];
  if (dVar7 <= 0.008856451679035631) {
    dVar8 = dVar7 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar8 = cbrt(dVar7);
  }
  *p = dVar8 * 116.0 + -16.0;
  dVar9 = dVar9 / dVar4;
  if (dVar9 <= 0.008856451679035631) {
    dVar9 = dVar9 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar9 = cbrt(dVar9);
  }
  if (dVar7 <= 0.008856451679035631) {
    dVar7 = dVar7 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar7 = cbrt(dVar7);
  }
  p[1] = (dVar9 - dVar7) * 500.0;
  dVar10 = dVar10 / dVar5;
  if (dVar10 <= 0.008856451679035631) {
    dVar9 = dVar10 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar9 = cbrt(dVar10);
  }
  p[2] = (dVar7 - dVar9) * 200.0;
  return;
}

Assistant:

void cie_lab(double *p) {
    double X = 0.0, Y = 0.0, Z = 0.0, Xw = xyz_whitepoint[0], Yw = xyz_whitepoint[1],
           Zw = xyz_whitepoint[2];

    for (int j = 0; j < 3; ++j) {
        X += p[j] * rgb_to_xyz[0][j];
        Y += p[j] * rgb_to_xyz[1][j];
        Z += p[j] * rgb_to_xyz[2][j];
    }

    auto f = [](double t) -> double {
        double delta = 6.0 / 29.0;
        if (t > delta * delta * delta)
            return cbrt(t);
        else
            return t / (delta * delta * 3.0) + (4.0 / 29.0);
    };

    p[0] = 116.0 * f(Y / Yw) - 16.0;
    p[1] = 500.0 * (f(X / Xw) - f(Y / Yw));
    p[2] = 200.0 * (f(Y / Yw) - f(Z / Zw));
}